

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_54d7c0::cmForEachFunctionBlocker::Replay
          (cmForEachFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  bool local_31;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions_local;
  cmForEachFunctionBlocker *this_local;
  
  if ((this->ZipLists & 1U) == 0) {
    local_31 = ReplayItems(this,functions,inStatus);
  }
  else {
    local_31 = ReplayZipLists(this,functions,inStatus);
  }
  return local_31;
}

Assistant:

bool cmForEachFunctionBlocker::Replay(
  std::vector<cmListFileFunction> functions, cmExecutionStatus& inStatus)
{
  return this->ZipLists ? this->ReplayZipLists(functions, inStatus)
                        : this->ReplayItems(functions, inStatus);
}